

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v1_encoder.cpp
# Opt level: O3

void __thiscall zmq::v1_encoder_t::size_ready(v1_encoder_t *this)

{
  uchar *puVar1;
  size_t sVar2;
  
  puVar1 = (uchar *)msg_t::data((this->super_encoder_base_t<zmq::v1_encoder_t>)._in_progress);
  sVar2 = msg_t::size((this->super_encoder_base_t<zmq::v1_encoder_t>)._in_progress);
  (this->super_encoder_base_t<zmq::v1_encoder_t>)._write_pos = puVar1;
  (this->super_encoder_base_t<zmq::v1_encoder_t>)._to_write = sVar2;
  (this->super_encoder_base_t<zmq::v1_encoder_t>)._next = (step_t)message_ready;
  *(undefined8 *)&(this->super_encoder_base_t<zmq::v1_encoder_t>).field_0x20 = 0;
  (this->super_encoder_base_t<zmq::v1_encoder_t>)._new_msg_flag = true;
  return;
}

Assistant:

void zmq::v1_encoder_t::size_ready ()
{
    //  Write message body into the buffer.
    next_step (in_progress ()->data (), in_progress ()->size (),
               &v1_encoder_t::message_ready, true);
}